

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * tinyfd_colorChooser(char *aTitle,char *aDefaultHexRGB,uchar *aDefaultRGB,uchar *aoResultRGB)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined8 uVar7;
  FILE *__stream;
  char *pcVar8;
  ushort **ppuVar9;
  long lVar10;
  undefined4 uVar11;
  size_t sStack_4d0;
  uchar lDefaultRGB [3];
  char lDefaultHexRGB [8];
  char lDialogString [1024];
  char lTmp [128];
  
  tinyfd_colorChooser::lBuff[0] = '\0';
  if (aDefaultHexRGB == (char *)0x0) {
    lDefaultRGB[0] = *aDefaultRGB;
    lDefaultRGB[1] = aDefaultRGB[1];
    lDefaultRGB[2] = aDefaultRGB[2];
    aDefaultHexRGB = lDefaultHexRGB;
    RGB2Hex(aDefaultRGB,aDefaultHexRGB);
  }
  else {
    Hex2RGB(aDefaultHexRGB,lDefaultRGB);
  }
  iVar4 = osascriptPresent();
  if (iVar4 == 0) {
    iVar5 = kdialogPresent();
    if (iVar5 == 0) {
      iVar5 = zenity3Present();
      if ((iVar5 == 0) && (iVar5 = matedialogPresent(), iVar5 == 0)) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        iVar5 = qarmaPresent();
        if (iVar5 == 0) {
          iVar5 = xdialogPresent();
          if (iVar5 != 0) {
            if (aTitle == (char *)0x0) {
              builtin_strncpy(lDialogString,"Xdialog --colorsel \"",0x15);
            }
            else {
              iVar5 = strcmp(aTitle,"tinyfd_query");
              if (iVar5 == 0) {
                uVar7 = 0x676f6c61696478;
                goto LAB_001174dc;
              }
              builtin_strncpy(lDialogString,"Xdialog --colorsel \"",0x15);
              if (*aTitle != '\0') {
                strcat(lDialogString,aTitle);
              }
            }
            sVar6 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar6,"\" 0 60 ",8);
            sprintf(lTmp,"%hhu %hhu %hhu",(ulong)lDefaultRGB[0],(ulong)lDefaultRGB[1],
                    (ulong)lDefaultRGB[2]);
            strcat(lDialogString,lTmp);
            sVar6 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar6," 2>&1",6);
            bVar3 = true;
            bVar2 = 1;
            goto LAB_0011762a;
          }
          iVar5 = tkinter2Present();
          if (iVar5 != 0) {
            if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
              uVar11._0_1_ = 'o';
              uVar11._1_1_ = 'n';
              uVar11._2_1_ = '2';
              uVar11._3_1_ = '-';
              goto LAB_00117c09;
            }
            strcpy(lDialogString,gPython2Name);
            iVar5 = isTerminalRunning();
            if ((iVar5 == 0) && (iVar5 = isDarwin(), iVar5 != 0)) {
              sVar6 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar6," -i",4);
            }
            sVar6 = strlen(lDialogString);
            memcpy(lDialogString + sVar6,
                   " -S -c \"import Tkinter,tkColorChooser;root=Tkinter.Tk();root.withdraw();",0x49)
            ;
            iVar5 = isDarwin();
            if (iVar5 != 0) {
              sVar6 = strlen(lDialogString);
              memcpy(lDialogString + sVar6,
                     "import os;os.system(\'\'\'osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                     ,0x6f);
            }
            sVar6 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar6,"res=tkColorChooser.askcolor(color=\'",0x24);
            strcat(lDialogString,aDefaultHexRGB);
            sVar6 = strlen(lDialogString);
            (lDialogString + sVar6)[0] = '\'';
            (lDialogString + sVar6)[1] = '\0';
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              sVar6 = strlen(lDialogString);
              builtin_strncpy(lDialogString + sVar6,",title=\'",9);
              strcat(lDialogString,aTitle);
              sVar6 = strlen(lDialogString);
              (lDialogString + sVar6)[0] = '\'';
              (lDialogString + sVar6)[1] = '\0';
            }
            sVar6 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar6,");\nif res[1] is not None:\n\tprint res[1]\"",
                            0x29);
            bVar3 = true;
            goto LAB_00117627;
          }
          iVar5 = tkinter3Present();
          if (iVar5 == 0) {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              pcVar8 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
              return pcVar8;
            }
            pcVar8 = tinyfd_inputBox(aTitle,"Enter hex rgb color (i.e. #f5ca20)",aDefaultHexRGB);
            if (pcVar8 == (char *)0x0) {
              return (char *)0x0;
            }
            sVar6 = strlen(pcVar8);
            if (sVar6 != 7) {
              return (char *)0x0;
            }
            if (*pcVar8 != '#') {
              return (char *)0x0;
            }
            ppuVar9 = __ctype_b_loc();
            lVar10 = 1;
            do {
              if (lVar10 == 7) {
                Hex2RGB(pcVar8,aoResultRGB);
                return pcVar8;
              }
              pcVar1 = pcVar8 + lVar10;
              lVar10 = lVar10 + 1;
            } while ((*(byte *)((long)*ppuVar9 + (long)*pcVar1 * 2 + 1) & 0x10) != 0);
            return (char *)0x0;
          }
          if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
            uVar11._0_1_ = 'o';
            uVar11._1_1_ = 'n';
            uVar11._2_1_ = '3';
            uVar11._3_1_ = '-';
LAB_00117c09:
            tinyfd_response._4_2_ = (undefined2)uVar11;
            tinyfd_response[6] = SUB41(uVar11,2);
            builtin_strncpy(tinyfd_response + 8,"tkinter",8);
            tinyfd_response[7] = SUB41(uVar11,3);
            builtin_strncpy(tinyfd_response,"pyth",4);
            return (char *)0x1;
          }
          strcpy(lDialogString,gPython3Name);
          sVar6 = strlen(lDialogString);
          memcpy(lDialogString + sVar6,
                 " -S -c \"import tkinter;from tkinter import colorchooser;root=tkinter.Tk();root.withdraw();"
                 ,0x5b);
          sVar6 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar6,"res=colorchooser.askcolor(color=\'",0x22);
          strcat(lDialogString,aDefaultHexRGB);
          sVar6 = strlen(lDialogString);
          (lDialogString + sVar6)[0] = '\'';
          (lDialogString + sVar6)[1] = '\0';
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            sVar6 = strlen(lDialogString);
            builtin_strncpy(lDialogString + sVar6,",title=\'",9);
            strcat(lDialogString,aTitle);
            sVar6 = strlen(lDialogString);
            (lDialogString + sVar6)[0] = '\'';
            (lDialogString + sVar6)[1] = '\0';
          }
          sVar6 = strlen(lDialogString);
          builtin_strncpy(lDialogString + sVar6,");\nif res[1] is not None:\n\tprint(res[1])\"",0x2a
                         );
          goto LAB_001173ae;
        }
      }
      iVar5 = zenity3Present();
      if (iVar5 == 0) {
        iVar5 = matedialogPresent();
        if (iVar5 == 0) {
          if (shellementaryPresent_lShellementaryPresent == '\0') {
            shellementaryPresent_lShellementaryPresent = '\x01';
          }
          if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
            builtin_strncpy(tinyfd_response,"qarma",6);
            return (char *)0x1;
          }
          builtin_strncpy(lDialogString,"qarma",6);
          pcVar8 = getenv("SSH_TTY");
          if (pcVar8 == (char *)0x0) {
            sVar6 = strlen(lDialogString);
            pcVar8 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
            sStack_4d0 = 0x41;
            goto LAB_00117557;
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
            builtin_strncpy(tinyfd_response,"matedialog",0xb);
            return (char *)0x1;
          }
          builtin_strncpy(lDialogString,"matedialog",0xb);
        }
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
          uVar7 = 0x337974696e657a;
LAB_001174dc:
          tinyfd_response._0_4_ = (undefined4)uVar7;
          tinyfd_response._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
          tinyfd_response[6] = (char)((ulong)uVar7 >> 0x30);
          tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
          return (char *)0x1;
        }
        builtin_strncpy(lDialogString,"zenity",7);
        iVar5 = zenity3Present();
        if ((3 < iVar5) && (pcVar8 = getenv("SSH_TTY"), pcVar8 == (char *)0x0)) {
          sVar6 = strlen(lDialogString);
          pcVar8 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
          sStack_4d0 = 0x4b;
LAB_00117557:
          memcpy(lDialogString + sVar6,pcVar8,sStack_4d0);
        }
      }
      sVar6 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar6," --color-selection --show-palette",0x22);
      sVar6 = strlen(lDialogString);
      sprintf(lDialogString + sVar6," --color=%s",aDefaultHexRGB);
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar6 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar6," --title=\"",0xb);
        strcat(lDialogString,aTitle);
        sVar6 = strlen(lDialogString);
        (lDialogString + sVar6)[0] = '\"';
        (lDialogString + sVar6)[1] = '\0';
      }
      if (tinyfd_silent != 0) {
        sVar6 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar6," 2>/dev/null ",0xe);
      }
      bVar3 = false;
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
        uVar7 = 0x676f6c6169646b;
        goto LAB_001174dc;
      }
      builtin_strncpy(lDialogString,"kdialog",8);
      iVar5 = kdialogPresent();
      if (iVar5 == 2) {
        sVar6 = strlen(lDialogString);
        memcpy(lDialogString + sVar6,
               " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
      }
      sVar6 = strlen(lDialogString);
      bVar2 = 0;
      sprintf(lDialogString + sVar6," --getcolor --default \'%s\'",aDefaultHexRGB);
      bVar3 = true;
      if (aTitle == (char *)0x0) goto LAB_0011762a;
      bVar3 = true;
      if (*aTitle != '\0') {
        sVar6 = strlen(lDialogString);
        builtin_strncpy(lDialogString + sVar6," --title \"",0xb);
        strcat(lDialogString,aTitle);
        sVar6 = strlen(lDialogString);
        (lDialogString + sVar6)[0] = '\"';
        (lDialogString + sVar6)[1] = '\0';
      }
    }
LAB_00117627:
    bVar2 = 0;
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    builtin_strncpy(lDialogString,"osascript",10);
    iVar5 = osx9orBetter();
    sVar6 = strlen(lDialogString);
    if (iVar5 == 0) {
      builtin_strncpy(lDialogString + sVar6,
                      " -e \'tell application \"System Events\"\' -e \'Activate\'",0x35);
      sVar6 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar6,
                      " -e \'try\' -e \'set mycolor to choose color default color {",0x3a);
    }
    else {
      memcpy(lDialogString + sVar6,
             " -e \'try\' -e \'tell app (path to frontmost application as Unicode text) to set mycolor to choose color default color {"
             ,0x76);
    }
    sprintf(lTmp,"%d",(ulong)lDefaultRGB[0] << 8);
    strcat(lDialogString,lTmp);
    sVar6 = strlen(lDialogString);
    (lDialogString + sVar6)[0] = ',';
    (lDialogString + sVar6)[1] = '\0';
    sprintf(lTmp,"%d",(ulong)lDefaultRGB[1] << 8);
    strcat(lDialogString,lTmp);
    sVar6 = strlen(lDialogString);
    (lDialogString + sVar6)[0] = ',';
    (lDialogString + sVar6)[1] = '\0';
    sprintf(lTmp,"%d",(ulong)lDefaultRGB[2] << 8);
    strcat(lDialogString,lTmp);
    sVar6 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar6,"}\' ",4);
    sVar6 = strlen(lDialogString);
    memcpy(lDialogString + sVar6,
           "-e \'set mystring to ((item 1 of mycolor) div 256 as integer) as string\' ",0x49);
    sVar6 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar6,"-e \'repeat with i from 2 to the count of mycolor\' ",
                    0x33);
    sVar6 = strlen(lDialogString);
    memcpy(lDialogString + sVar6,
           "-e \'set mystring to mystring & \" \" & ((item i of mycolor) div 256 as integer) as string\' "
           ,0x5a);
    sVar6 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar6,"-e \'end repeat\' ",0x11);
    sVar6 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar6,"-e \'mystring\' ",0xf);
    sVar6 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar6,"-e \'on error number -128\' ",0x1b);
    sVar6 = strlen(lDialogString);
    builtin_strncpy(lDialogString + sVar6,"-e \'end try\'",0xd);
    iVar5 = osx9orBetter();
    if (iVar5 == 0) {
      sVar6 = strlen(lDialogString);
      builtin_strncpy(lDialogString + sVar6," -e \'end tell\'",0xf);
    }
LAB_001173ae:
    bVar2 = 0;
    bVar3 = true;
  }
LAB_0011762a:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lDialogString);
  }
  __stream = popen(lDialogString,"r");
  if (__stream != (FILE *)0x0) {
    do {
      pcVar8 = fgets(tinyfd_colorChooser::lBuff,0x80,__stream);
    } while (pcVar8 != (char *)0x0);
    pclose(__stream);
    sVar6 = strlen(tinyfd_colorChooser::lBuff);
    if (sVar6 != 0) {
      if (tinyfd_selectFolderDialog::lBuff[sVar6 + 0x3ff] == '\n') {
        tinyfd_selectFolderDialog::lBuff[sVar6 + 0x3ff] = '\0';
      }
      if (bVar3) {
        if ((bool)(iVar4 == 0 & (bVar2 ^ 1))) {
LAB_0011772e:
          Hex2RGB(tinyfd_colorChooser::lBuff,aoResultRGB);
          return tinyfd_colorChooser::lBuff;
        }
        pcVar8 = "%hhu %hhu %hhu";
      }
      else {
        if (tinyfd_colorChooser::lBuff[0] == '#') {
          sVar6 = strlen(tinyfd_colorChooser::lBuff);
          if (7 < sVar6) {
            tinyfd_colorChooser::lBuff[3] = tinyfd_colorChooser::lBuff[5];
            tinyfd_colorChooser::lBuff[4] = tinyfd_colorChooser::lBuff[6];
            tinyfd_colorChooser::lBuff[5] = tinyfd_colorChooser::lBuff[9];
            tinyfd_colorChooser::lBuff[6] = tinyfd_colorChooser::lBuff[10];
            tinyfd_colorChooser::lBuff[7] = '\0';
          }
          goto LAB_0011772e;
        }
        if (tinyfd_colorChooser::lBuff[3] == '(') {
          pcVar8 = "rgb(%hhu,%hhu,%hhu";
        }
        else {
          if (tinyfd_colorChooser::lBuff[4] != '(') {
            return tinyfd_colorChooser::lBuff;
          }
          pcVar8 = "rgba(%hhu,%hhu,%hhu";
        }
      }
      __isoc99_sscanf(tinyfd_colorChooser::lBuff,pcVar8,aoResultRGB,aoResultRGB + 1,aoResultRGB + 2)
      ;
      RGB2Hex(aoResultRGB,tinyfd_colorChooser::lBuff);
      return tinyfd_colorChooser::lBuff;
    }
  }
  return (char *)0x0;
}

Assistant:

char const * tinyfd_colorChooser(
        char const * const aTitle, /* NULL or "" */
        char const * const aDefaultHexRGB, /* NULL or "#FF0000"*/
        unsigned char const aDefaultRGB[3], /* { 0 , 255 , 255 } */
        unsigned char aoResultRGB[3]) /* { 0 , 0 , 0 } */
{
        char lDefaultHexRGB[8];
        char * lpDefaultHexRGB;
        int i;
        char const * p ;

#ifndef TINYFD_NOLIB
        if ( (!tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent()) )
          && (!getenv("SSH_CLIENT") || getenv("DISPLAY")) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        return colorChooserWinGui8(
                                aTitle, aDefaultHexRGB, aDefaultRGB, aoResultRGB);
                }
                else
                {
                        return colorChooserWinGuiA(
                                aTitle, aDefaultHexRGB, aDefaultRGB, aoResultRGB);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( aDefaultHexRGB )
        {
                lpDefaultHexRGB = (char *) aDefaultHexRGB ;
        }
        else
        {
                RGB2Hex( aDefaultRGB , lDefaultHexRGB ) ;
                lpDefaultHexRGB = (char *) lDefaultHexRGB ;
        }
        p = tinyfd_inputBox(aTitle,
                        "Enter hex rgb color (i.e. #f5ca20)",lpDefaultHexRGB);
        if (aTitle&&!strcmp(aTitle,"tinyfd_query")) return p;

        if ( !p || (strlen(p) != 7) || (p[0] != '#') )
        {
                return NULL ;
        }
        for ( i = 1 ; i < 7 ; i ++ )
        {
                if ( ! isxdigit( p[i] ) )
                {
                        return NULL ;
                }
        }
        Hex2RGB(p,aoResultRGB);
        return p ;
}